

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O3

void av1_convolve_2d_facade
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams **interp_filters,int subpel_x_qn,int x_step_q4,int subpel_y_qn,
               int y_step_q4,int scaled,ConvolveParams *conv_params)

{
  InterpFilterParams *pIVar1;
  _func_void_uint8_t_ptr_int_uint8_t_ptr_int_int_int_ConvolveParams_ptr **pp_Var2;
  ulong uVar3;
  _func_void_uint8_t_ptr_int_uint8_t_ptr_int_int_int_InterpFilterParams_ptr_InterpFilterParams_ptr_int_int_ConvolveParams_ptr
  **pp_Var4;
  int iVar5;
  uint8_t *puVar6;
  _func_void_uint8_t_ptr_int_uint8_t_ptr_int_int_int_InterpFilterParams_ptr_int_ConvolveParams_ptr
  **pp_Var7;
  InterpFilterParams *in_stack_ffffffffffffff98;
  InterpFilterParams *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  ConvolveParams *in_stack_ffffffffffffffb8;
  ConvolveParams *pCVar8;
  int in_stack_ffffffffffffffc0;
  
  pIVar1 = *interp_filters;
  pCVar8 = (ConvolveParams *)interp_filters[1];
  if ((pIVar1->taps == 2) || (*(uint16_t *)&pCVar8->dst == 2)) {
    if (subpel_y_qn != 0 && subpel_x_qn != 0) {
      av1_convolve_2d_sr_intrabc_c
                (src,src_stride,dst,dst_stride,w,h,in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffb8);
      return;
    }
    if (subpel_x_qn != 0) {
      if (h < 1) {
        return;
      }
      iVar5 = 0;
      do {
        if (0 < w) {
          uVar3 = 0;
          do {
            dst[uVar3] = (uint8_t)((uint)src[uVar3] + (uint)src[uVar3 + 1] + 1 >> 1);
            uVar3 = uVar3 + 1;
          } while ((uint)w != uVar3);
        }
        src = src + src_stride;
        dst = dst + dst_stride;
        iVar5 = iVar5 + 1;
      } while (iVar5 != h);
      return;
    }
    if (subpel_y_qn != 0) {
      if (h < 1) {
        return;
      }
      puVar6 = src + src_stride;
      iVar5 = 0;
      do {
        if (0 < w) {
          uVar3 = 0;
          do {
            dst[uVar3] = (uint8_t)((uint)src[uVar3] + (uint)puVar6[uVar3] + 1 >> 1);
            uVar3 = uVar3 + 1;
          } while ((uint)w != uVar3);
        }
        src = src + src_stride;
        dst = dst + dst_stride;
        iVar5 = iVar5 + 1;
        puVar6 = puVar6 + src_stride;
      } while (iVar5 != h);
      return;
    }
  }
  if (scaled != 0) {
    (*av1_convolve_2d_scale)
              (src,src_stride,dst,dst_stride,w,h,pIVar1,(InterpFilterParams *)pCVar8,subpel_x_qn,
               x_step_q4,subpel_y_qn,y_step_q4,conv_params);
    return;
  }
  if (conv_params->is_compound == 0) {
    if (subpel_x_qn == 0 && subpel_y_qn == 0) {
      (*aom_convolve_copy)(src,(long)src_stride,dst,(long)dst_stride,w,h);
      return;
    }
    if (subpel_x_qn == 0 || subpel_y_qn != 0) {
      if (subpel_x_qn != 0 || subpel_y_qn == 0) {
        pp_Var4 = &av1_convolve_2d_sr;
        goto LAB_00399f9b;
      }
      pp_Var2 = (_func_void_uint8_t_ptr_int_uint8_t_ptr_int_int_int_ConvolveParams_ptr **)
                &av1_convolve_y_sr;
      in_stack_ffffffffffffffc0 = subpel_y_qn;
      goto LAB_00399f3f;
    }
    pp_Var7 = &av1_convolve_x_sr;
  }
  else {
    if (subpel_x_qn == 0 && subpel_y_qn == 0) {
      pp_Var2 = &av1_dist_wtd_convolve_2d_copy;
      pCVar8 = conv_params;
LAB_00399f3f:
      (**pp_Var2)(src,src_stride,dst,dst_stride,w,h,(InterpFilterParams *)pCVar8,
                  in_stack_ffffffffffffffc0);
      return;
    }
    if (subpel_x_qn == 0 || subpel_y_qn != 0) {
      if (subpel_x_qn == 0 && subpel_y_qn != 0) {
        (*av1_dist_wtd_convolve_y)
                  (src,src_stride,dst,dst_stride,w,h,(InterpFilterParams *)pCVar8,subpel_y_qn,
                   conv_params);
        return;
      }
      pp_Var4 = &av1_dist_wtd_convolve_2d;
LAB_00399f9b:
      (**pp_Var4)(src,src_stride,dst,dst_stride,w,h,pIVar1,(InterpFilterParams *)pCVar8,subpel_x_qn,
                  subpel_y_qn,conv_params);
      return;
    }
    pp_Var7 = &av1_dist_wtd_convolve_x;
  }
  (**pp_Var7)(src,src_stride,dst,dst_stride,w,h,pIVar1,subpel_x_qn,conv_params);
  return;
}

Assistant:

void av1_convolve_2d_facade(const uint8_t *src, int src_stride, uint8_t *dst,
                            int dst_stride, int w, int h,
                            const InterpFilterParams *interp_filters[2],
                            const int subpel_x_qn, int x_step_q4,
                            const int subpel_y_qn, int y_step_q4, int scaled,
                            ConvolveParams *conv_params) {
  (void)x_step_q4;
  (void)y_step_q4;
  (void)dst;
  (void)dst_stride;

  const InterpFilterParams *filter_params_x = interp_filters[0];
  const InterpFilterParams *filter_params_y = interp_filters[1];

  // TODO(jingning, yunqing): Add SIMD support to 2-tap filter case.
  // 2-tap filter indicates that it is for IntraBC.
  if (filter_params_x->taps == 2 || filter_params_y->taps == 2) {
    assert(filter_params_x->taps == 2 && filter_params_y->taps == 2);
    assert(!scaled);
    if (subpel_x_qn && subpel_y_qn) {
      av1_convolve_2d_sr_intrabc(src, src_stride, dst, dst_stride, w, h,
                                 filter_params_x, filter_params_y, subpel_x_qn,
                                 subpel_y_qn, conv_params);
      return;
    } else if (subpel_x_qn) {
      av1_convolve_x_sr_intrabc(src, src_stride, dst, dst_stride, w, h,
                                filter_params_x, subpel_x_qn, conv_params);
      return;
    } else if (subpel_y_qn) {
      av1_convolve_y_sr_intrabc(src, src_stride, dst, dst_stride, w, h,
                                filter_params_y, subpel_y_qn);
      return;
    }
  }

  if (scaled) {
    convolve_2d_scale_wrapper(src, src_stride, dst, dst_stride, w, h,
                              filter_params_x, filter_params_y, subpel_x_qn,
                              x_step_q4, subpel_y_qn, y_step_q4, conv_params);
  } else if (conv_params->is_compound) {
    convolve_2d_facade_compound(src, src_stride, dst, dst_stride, w, h,
                                filter_params_x, filter_params_y, subpel_x_qn,
                                subpel_y_qn, conv_params);
  } else {
    convolve_2d_facade_single(src, src_stride, dst, dst_stride, w, h,
                              filter_params_x, filter_params_y, subpel_x_qn,
                              subpel_y_qn, conv_params);
  }
}